

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void lws_system_cpd_set(lws_context *cx,lws_cpd_result_t result)

{
  if (cx->captive_portal_detect == '\0') {
    _lws_log_cx(cx->log_cx,lws_log_prepend_context,cx,4,"lws_system_cpd_set","setting CPD result %s"
                ,cname[result]);
    cx->captive_portal_detect = (uint8_t)result;
    lws_smd_msg_printf(cx,4,"{\"type\":\"cpd\",\"result\":\"%s\"}",cname[(ulong)result & 0xff]);
    if ((cx->mgr_system).state != 0xd) {
      lws_state_transition_steps(&cx->mgr_system,0xc);
      return;
    }
  }
  return;
}

Assistant:

void
lws_system_cpd_set(struct lws_context *cx, lws_cpd_result_t result)
{
	if (cx->captive_portal_detect != LWS_CPD_UNKNOWN)
		return;

#if !defined(LWS_WITH_NO_LOGS)
	lwsl_cx_notice(cx, "setting CPD result %s", cname[result]);
#endif

	cx->captive_portal_detect = (uint8_t)result;

#if defined(LWS_WITH_SYS_STATE)
#if defined(LWS_WITH_SYS_SMD)
	lws_smd_msg_printf(cx, LWSSMDCL_NETWORK,
			   "{\"type\":\"cpd\",\"result\":\"%s\"}",
			   cname[cx->captive_portal_detect]);
#endif

	/* if nothing is there to intercept anything, go all the way */
	if (cx->mgr_system.state != LWS_SYSTATE_POLICY_INVALID)
		lws_state_transition_steps(&cx->mgr_system,
					   LWS_SYSTATE_OPERATIONAL);
#endif
}